

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall
duckdb::BuiltinFunctions::AddCollation
          (BuiltinFunctions *this,string *name,ScalarFunction *function,bool combinable,
          bool not_required_for_equality)

{
  CreateCollationInfo info;
  string local_3e0;
  ScalarFunction local_3c0;
  CreateCollationInfo local_298;
  
  ::std::__cxx11::string::string((string *)&local_3e0,(string *)name);
  ScalarFunction::ScalarFunction(&local_3c0,function);
  CreateCollationInfo::CreateCollationInfo
            (&local_298,&local_3e0,&local_3c0,combinable,not_required_for_equality);
  ScalarFunction::~ScalarFunction(&local_3c0);
  ::std::__cxx11::string::~string((string *)&local_3e0);
  local_298.super_CreateInfo.internal = true;
  Catalog::CreateCollation(this->catalog,this->transaction,&local_298);
  CreateCollationInfo::~CreateCollationInfo(&local_298);
  return;
}

Assistant:

void BuiltinFunctions::AddCollation(string name, ScalarFunction function, bool combinable,
                                    bool not_required_for_equality) {
	CreateCollationInfo info(std::move(name), std::move(function), combinable, not_required_for_equality);
	info.internal = true;
	catalog.CreateCollation(transaction, info);
}